

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

void remove_a_file(string *file_name)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = remove((file_name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    std::operator+(&local_30,"\n!! Problems deleting file_name \'",file_name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_50.field_2._M_allocated_capacity = *psVar3;
      local_50.field_2._8_8_ = plVar2[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar3;
      local_50._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_50._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    write_colored_text(&local_50,red);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void remove_a_file(const string &file_name) {
    // See also https://www.geeksforgeeks.org/c-program-delete-file/
    if (remove(file_name.c_str()) != 0) {
        write_colored_text("\n!! Problems deleting file_name '" + file_name + "'. Aborting!\n");
        return;
    }
}